

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawMaybeAliased
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  EpsCopyOutputStream *in_RSI;
  uint8 *in_RDI;
  int size_00;
  undefined4 in_stack_ffffffffffffffe0;
  uint8 *local_8;
  
  size_00 = (int)((ulong)in_RCX >> 0x20);
  if ((in_RDI[0x39] & 1) == 0) {
    local_8 = WriteRaw(in_RSI,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),size_00,in_RDI);
  }
  else {
    local_8 = WriteAliasedRaw(in_RSI,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),size_00,
                              in_RDI);
  }
  return local_8;
}

Assistant:

uint8* WriteRawMaybeAliased(const void* data, int size, uint8* ptr) {
    if (aliasing_enabled_) {
      return WriteAliasedRaw(data, size, ptr);
    } else {
      return WriteRaw(data, size, ptr);
    }
  }